

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_amount.cpp
# Opt level: O0

void __thiscall
Amount_ComparisonOperatorsTest_Test::TestBody(Amount_ComparisonOperatorsTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  Amount AVar3;
  string local_f30;
  AssertHelper local_f10;
  Message local_f08;
  int64_t local_f00;
  undefined1 local_ef8;
  Amount local_ef0;
  bool local_ed9;
  undefined1 local_ed8 [8];
  AssertionResult gtest_ar__43;
  AssertHelper local_ea8;
  Message local_ea0;
  int64_t local_e98;
  undefined1 local_e90;
  Amount local_e88;
  bool local_e71;
  undefined1 local_e70 [8];
  AssertionResult gtest_ar__42;
  AssertHelper local_e40;
  Message local_e38;
  int64_t local_e30;
  undefined1 local_e28;
  Amount local_e20;
  bool local_e09;
  undefined1 local_e08 [8];
  AssertionResult gtest_ar__41;
  AssertHelper local_dd8;
  Message local_dd0;
  int64_t local_dc8;
  undefined1 local_dc0;
  Amount local_db8;
  bool local_da1;
  undefined1 local_da0 [8];
  AssertionResult gtest_ar__40;
  AssertHelper local_d70;
  Message local_d68;
  bool local_d59;
  undefined1 local_d58 [8];
  AssertionResult gtest_ar__39;
  AssertHelper local_d28;
  Message local_d20;
  bool local_d11;
  undefined1 local_d10 [8];
  AssertionResult gtest_ar__38;
  AssertHelper local_ce0;
  Message local_cd8;
  bool local_cc9;
  undefined1 local_cc8 [8];
  AssertionResult gtest_ar__37;
  AssertHelper local_c98;
  Message local_c90;
  bool local_c81;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar__36;
  AssertHelper local_c50;
  Message local_c48;
  int64_t local_c40;
  undefined1 local_c38;
  Amount local_c30;
  bool local_c19;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar__35;
  AssertHelper local_be8;
  Message local_be0;
  int64_t local_bd8;
  undefined1 local_bd0;
  Amount local_bc8;
  bool local_bb1;
  undefined1 local_bb0 [8];
  AssertionResult gtest_ar__34;
  AssertHelper local_b80;
  Message local_b78;
  int64_t local_b70;
  undefined1 local_b68;
  Amount local_b60;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar__33;
  AssertHelper local_b18;
  Message local_b10;
  int64_t local_b08;
  undefined1 local_b00;
  Amount local_af8;
  bool local_ae1;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar__32;
  AssertHelper local_ab0;
  Message local_aa8;
  bool local_a99;
  undefined1 local_a98 [8];
  AssertionResult gtest_ar__31;
  AssertHelper local_a68;
  Message local_a60;
  bool local_a51;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar__30;
  AssertHelper local_a20;
  Message local_a18;
  bool local_a09;
  undefined1 local_a08 [8];
  AssertionResult gtest_ar__29;
  AssertHelper local_9d8;
  Message local_9d0;
  bool local_9c1;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar__28;
  AssertHelper local_990;
  Message local_988;
  int64_t local_980;
  undefined1 local_978;
  Amount local_970;
  bool local_959;
  undefined1 local_958 [8];
  AssertionResult gtest_ar__27;
  AssertHelper local_928;
  Message local_920;
  int64_t local_918;
  undefined1 local_910;
  Amount local_908;
  bool local_8f1;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_8c0;
  Message local_8b8;
  int64_t local_8b0;
  undefined1 local_8a8;
  Amount local_8a0;
  bool local_889;
  undefined1 local_888 [8];
  AssertionResult gtest_ar__25;
  AssertHelper local_858;
  Message local_850;
  int64_t local_848;
  undefined1 local_840;
  Amount local_838;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_7f0;
  Message local_7e8;
  bool local_7d9;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar__23;
  AssertHelper local_7a8;
  Message local_7a0;
  bool local_791;
  undefined1 local_790 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_760;
  Message local_758;
  bool local_749;
  undefined1 local_748 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_718;
  Message local_710;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_6d0;
  Message local_6c8;
  int64_t local_6c0;
  undefined1 local_6b8;
  Amount local_6b0;
  bool local_699;
  undefined1 local_698 [8];
  AssertionResult gtest_ar__19;
  AssertHelper local_668;
  Message local_660;
  int64_t local_658;
  undefined1 local_650;
  Amount local_648;
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_600;
  Message local_5f8;
  int64_t local_5f0;
  undefined1 local_5e8;
  Amount local_5e0;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_598;
  Message local_590;
  int64_t local_588;
  undefined1 local_580;
  Amount local_578;
  bool local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_530;
  Message local_528;
  bool local_519;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_4e8;
  Message local_4e0;
  bool local_4d1;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_4a0;
  Message local_498;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_458;
  Message local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_410;
  Message local_408;
  int64_t local_400;
  undefined1 local_3f8;
  Amount local_3f0;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_3a8;
  Message local_3a0;
  int64_t local_398;
  undefined1 local_390;
  Amount local_388;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_340;
  Message local_338;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2b0;
  Message local_2a8;
  bool local_299;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_268;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_220;
  Message local_218;
  int64_t local_210;
  undefined1 local_208;
  Amount local_200;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1b8;
  Message local_1b0;
  int64_t local_1a8;
  undefined1 local_1a0;
  Amount local_198;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  bool local_f1;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c0;
  Message local_b8;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_78;
  Message local_70 [3];
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  int64_t nq_satoshi_val;
  undefined1 local_28 [8];
  Amount base_amt;
  int64_t base_satoshi_val;
  Amount_ComparisonOperatorsTest_Test *this_local;
  
  base_amt.ignore_check_ = true;
  base_amt._9_7_ = 0x499602;
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_28 = (undefined1  [8])AVar3.amount_;
  base_amt.amount_._0_1_ = AVar3.ignore_check_;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x499602d3;
  local_51 = cfd::core::operator==(0x499602d2,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_50,
               (AssertionResult *)"base_satoshi_val == base_amt","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_a9 = cfd::core::operator==(0x499602d3,(Amount *)local_28);
  local_a9 = !local_a9;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_a8,
               (AssertionResult *)"nq_satoshi_val == base_amt","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_f1 = cfd::core::Amount::operator==((Amount *)local_28,0x499602d2);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_f0,&local_f1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_f0,
               (AssertionResult *)"base_amt == base_satoshi_val","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_139 = cfd::core::Amount::operator==((Amount *)local_28,0x499602d3);
  local_139 = !local_139;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_138,
               (AssertionResult *)"base_amt == nq_satoshi_val","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x6b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_1a8 = AVar3.amount_;
  local_1a0 = AVar3.ignore_check_;
  local_198.amount_ = local_1a8;
  local_198.ignore_check_ = (bool)local_1a0;
  local_181 = cfd::core::Amount::operator==((Amount *)local_28,&local_198);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_180,&local_181,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_180,
               (AssertionResult *)"base_amt == Amount::CreateBySatoshiAmount(base_satoshi_val)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_210 = AVar3.amount_;
  local_208 = AVar3.ignore_check_;
  local_200.amount_ = local_210;
  local_200.ignore_check_ = (bool)local_208;
  local_1e9 = cfd::core::Amount::operator==((Amount *)local_28,&local_200);
  local_1e9 = !local_1e9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_1e8,
               (AssertionResult *)"base_amt == Amount::CreateBySatoshiAmount(nq_satoshi_val)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x6d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_251 = cfd::core::operator!=(0x499602d3,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_250,
               (AssertionResult *)"nq_satoshi_val != base_amt","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_299 = cfd::core::operator!=(0x499602d2,(Amount *)local_28);
  local_299 = !local_299;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_298,&local_299,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_298,
               (AssertionResult *)"base_satoshi_val != base_amt","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2e1 = cfd::core::Amount::operator!=((Amount *)local_28,0x499602d3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_2e0,
               (AssertionResult *)"base_amt != nq_satoshi_val","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  local_329 = cfd::core::Amount::operator!=((Amount *)local_28,0x499602d2);
  local_329 = !local_329;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_328,
               (AssertionResult *)"base_amt != base_satoshi_val","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_340,&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_340);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_398 = AVar3.amount_;
  local_390 = AVar3.ignore_check_;
  local_388.amount_ = local_398;
  local_388.ignore_check_ = (bool)local_390;
  local_371 = cfd::core::Amount::operator!=((Amount *)local_28,&local_388);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_370,
               (AssertionResult *)"base_amt != Amount::CreateBySatoshiAmount(nq_satoshi_val)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_400 = AVar3.amount_;
  local_3f8 = AVar3.ignore_check_;
  local_3f0.amount_ = local_400;
  local_3f0.ignore_check_ = (bool)local_3f8;
  local_3d9 = cfd::core::Amount::operator!=((Amount *)local_28,&local_3f0);
  local_3d9 = !local_3d9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_3d8,
               (AssertionResult *)"base_amt != Amount::CreateBySatoshiAmount(base_satoshi_val)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_441 = cfd::core::operator<(0x499602d3,(Amount *)local_28);
  local_441 = !local_441;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_440,
               (AssertionResult *)"nq_satoshi_val < base_amt","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_489 = cfd::core::operator<(0x499602d2,(Amount *)local_28);
  local_489 = !local_489;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,&local_489,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_488,
               (AssertionResult *)"base_satoshi_val < base_amt","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  local_4d1 = cfd::core::operator<((Amount *)local_28,0x499602d3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d0,&local_4d1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__15.message_,(internal *)local_4d0,
               (AssertionResult *)"base_amt < nq_satoshi_val","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  local_519 = cfd::core::operator<((Amount *)local_28,0x499602d2);
  local_519 = !local_519;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_518,&local_519,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_518,
               (AssertionResult *)"base_amt < base_satoshi_val","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=(&local_530,&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_588 = AVar3.amount_;
  local_580 = AVar3.ignore_check_;
  local_578.amount_ = local_588;
  local_578.ignore_check_ = (bool)local_580;
  local_561 = cfd::core::operator<(&local_578,(Amount *)local_28);
  local_561 = !local_561;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_560,&local_561,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__17.message_,(internal *)local_560,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(nq_satoshi_val) < base_amt","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_5f0 = AVar3.amount_;
  local_5e8 = AVar3.ignore_check_;
  local_5e0.amount_ = local_5f0;
  local_5e0.ignore_check_ = (bool)local_5e8;
  local_5c9 = cfd::core::operator<(&local_5e0,(Amount *)local_28);
  local_5c9 = !local_5c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_5c8,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(base_satoshi_val) < base_amt",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_600,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_600,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper(&local_600);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_658 = AVar3.amount_;
  local_650 = AVar3.ignore_check_;
  local_648.amount_ = local_658;
  local_648.ignore_check_ = (bool)local_650;
  local_631 = cfd::core::operator<((Amount *)local_28,&local_648);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_630,&local_631,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_660);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__19.message_,(internal *)local_630,
               (AssertionResult *)"base_amt < Amount::CreateBySatoshiAmount(nq_satoshi_val)","false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_668,&local_660);
    testing::internal::AssertHelper::~AssertHelper(&local_668);
    std::__cxx11::string::~string((string *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_660);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_6c0 = AVar3.amount_;
  local_6b8 = AVar3.ignore_check_;
  local_6b0.amount_ = local_6c0;
  local_6b0.ignore_check_ = (bool)local_6b8;
  local_699 = cfd::core::operator<((Amount *)local_28,&local_6b0);
  local_699 = !local_699;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_698,&local_699,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_698,
               (AssertionResult *)"base_amt < Amount::CreateBySatoshiAmount(base_satoshi_val)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  local_701 = cfd::core::operator>(0x499602d3,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_700,&local_701,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar1) {
    testing::Message::Message(&local_710);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__21.message_,(internal *)local_700,
               (AssertionResult *)"nq_satoshi_val > base_amt","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_718,&local_710);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  local_749 = cfd::core::operator>(0x499602d2,(Amount *)local_28);
  local_749 = !local_749;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_748,&local_749,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_748,
               (AssertionResult *)"base_satoshi_val > base_amt","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  local_791 = cfd::core::operator>((Amount *)local_28,0x499602d3);
  local_791 = !local_791;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_790,&local_791,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__23.message_,(internal *)local_790,
               (AssertionResult *)"base_amt > nq_satoshi_val","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x81,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    std::__cxx11::string::~string((string *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  local_7d9 = cfd::core::operator>((Amount *)local_28,0x499602d2);
  local_7d9 = !local_7d9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7d8,&local_7d9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_7d8,
               (AssertionResult *)"base_amt > base_satoshi_val","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f0);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_848 = AVar3.amount_;
  local_840 = AVar3.ignore_check_;
  local_838.amount_ = local_848;
  local_838.ignore_check_ = (bool)local_840;
  local_821 = cfd::core::operator>(&local_838,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_820,&local_821,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__25.message_,(internal *)local_820,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(nq_satoshi_val) > base_amt","false"
               ,"true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=(&local_858,&local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_858);
    std::__cxx11::string::~string((string *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_8b0 = AVar3.amount_;
  local_8a8 = AVar3.ignore_check_;
  local_8a0.amount_ = local_8b0;
  local_8a0.ignore_check_ = (bool)local_8a8;
  local_889 = cfd::core::operator>(&local_8a0,(Amount *)local_28);
  local_889 = !local_889;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_888,&local_889,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_888,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(base_satoshi_val) > base_amt",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x84,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8c0,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper(&local_8c0);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_918 = AVar3.amount_;
  local_910 = AVar3.ignore_check_;
  local_908.amount_ = local_918;
  local_908.ignore_check_ = (bool)local_910;
  local_8f1 = cfd::core::operator>((Amount *)local_28,&local_908);
  local_8f1 = !local_8f1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8f0,&local_8f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar1) {
    testing::Message::Message(&local_920);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__27.message_,(internal *)local_8f0,
               (AssertionResult *)"base_amt > Amount::CreateBySatoshiAmount(nq_satoshi_val)","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=(&local_928,&local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_928);
    std::__cxx11::string::~string((string *)&gtest_ar__27.message_);
    testing::Message::~Message(&local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_980 = AVar3.amount_;
  local_978 = AVar3.ignore_check_;
  local_970.amount_ = local_980;
  local_970.ignore_check_ = (bool)local_978;
  local_959 = cfd::core::operator>((Amount *)local_28,&local_970);
  local_959 = !local_959;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_958,&local_959,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
  if (!bVar1) {
    testing::Message::Message(&local_988);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__28.message_,(internal *)local_958,
               (AssertionResult *)"base_amt > Amount::CreateBySatoshiAmount(base_satoshi_val)",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_990,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=(&local_990,&local_988);
    testing::internal::AssertHelper::~AssertHelper(&local_990);
    std::__cxx11::string::~string((string *)&gtest_ar__28.message_);
    testing::Message::~Message(&local_988);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
  local_9c1 = cfd::core::operator<=(0x499602d3,(Amount *)local_28);
  local_9c1 = !local_9c1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_9c0,&local_9c1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__29.message_,(internal *)local_9c0,
               (AssertionResult *)"nq_satoshi_val <= base_amt","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9d8,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper(&local_9d8);
    std::__cxx11::string::~string((string *)&gtest_ar__29.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9c0);
  local_a09 = cfd::core::operator<=(0x499602d2,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a08,&local_a09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__30.message_,(internal *)local_a08,
               (AssertionResult *)"base_satoshi_val <= base_amt","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,&local_a18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    std::__cxx11::string::~string((string *)&gtest_ar__30.message_);
    testing::Message::~Message(&local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a08);
  local_a51 = cfd::core::operator<=((Amount *)local_28,0x499602d3);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a50,&local_a51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar1) {
    testing::Message::Message(&local_a60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__31.message_,(internal *)local_a50,
               (AssertionResult *)"base_amt <= nq_satoshi_val","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a68,&local_a60);
    testing::internal::AssertHelper::~AssertHelper(&local_a68);
    std::__cxx11::string::~string((string *)&gtest_ar__31.message_);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  local_a99 = cfd::core::operator<=((Amount *)local_28,0x499602d2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a98,&local_a99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
  if (!bVar1) {
    testing::Message::Message(&local_aa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__32.message_,(internal *)local_a98,
               (AssertionResult *)"base_amt <= base_satoshi_val","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ab0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ab0,&local_aa8);
    testing::internal::AssertHelper::~AssertHelper(&local_ab0);
    std::__cxx11::string::~string((string *)&gtest_ar__32.message_);
    testing::Message::~Message(&local_aa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_b08 = AVar3.amount_;
  local_b00 = AVar3.ignore_check_;
  local_af8.amount_ = local_b08;
  local_af8.ignore_check_ = (bool)local_b00;
  local_ae1 = cfd::core::operator<=(&local_af8,(Amount *)local_28);
  local_ae1 = !local_ae1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ae0,&local_ae1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae0);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__33.message_,(internal *)local_ae0,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(nq_satoshi_val) <= base_amt","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b18,&local_b10);
    testing::internal::AssertHelper::~AssertHelper(&local_b18);
    std::__cxx11::string::~string((string *)&gtest_ar__33.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae0);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_b70 = AVar3.amount_;
  local_b68 = AVar3.ignore_check_;
  local_b60.amount_ = local_b70;
  local_b60.ignore_check_ = (bool)local_b68;
  local_b49 = cfd::core::operator<=(&local_b60,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
  if (!bVar1) {
    testing::Message::Message(&local_b78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__34.message_,(internal *)local_b48,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(base_satoshi_val) <= base_amt",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b80,&local_b78);
    testing::internal::AssertHelper::~AssertHelper(&local_b80);
    std::__cxx11::string::~string((string *)&gtest_ar__34.message_);
    testing::Message::~Message(&local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_bd8 = AVar3.amount_;
  local_bd0 = AVar3.ignore_check_;
  local_bc8.amount_ = local_bd8;
  local_bc8.ignore_check_ = (bool)local_bd0;
  local_bb1 = cfd::core::operator<=((Amount *)local_28,&local_bc8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bb0,&local_bb1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bb0);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__35.message_,(internal *)local_bb0,
               (AssertionResult *)"base_amt <= Amount::CreateBySatoshiAmount(nq_satoshi_val)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_be8,&local_be0);
    testing::internal::AssertHelper::~AssertHelper(&local_be8);
    std::__cxx11::string::~string((string *)&gtest_ar__35.message_);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bb0);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_c40 = AVar3.amount_;
  local_c38 = AVar3.ignore_check_;
  local_c30.amount_ = local_c40;
  local_c30.ignore_check_ = (bool)local_c38;
  local_c19 = cfd::core::operator<=((Amount *)local_28,&local_c30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c18,&local_c19,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(&local_c48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__36.message_,(internal *)local_c18,
               (AssertionResult *)"base_amt <= Amount::CreateBySatoshiAmount(base_satoshi_val)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c50,&local_c48);
    testing::internal::AssertHelper::~AssertHelper(&local_c50);
    std::__cxx11::string::~string((string *)&gtest_ar__36.message_);
    testing::Message::~Message(&local_c48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  local_c81 = cfd::core::operator>=(0x499602d3,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c80,&local_c81,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(&local_c90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__37.message_,(internal *)local_c80,
               (AssertionResult *)"nq_satoshi_val >= base_amt","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
    testing::internal::AssertHelper::~AssertHelper(&local_c98);
    std::__cxx11::string::~string((string *)&gtest_ar__37.message_);
    testing::Message::~Message(&local_c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  local_cc9 = cfd::core::operator>=(0x499602d2,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_cc8,&local_cc9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc8);
  if (!bVar1) {
    testing::Message::Message(&local_cd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__38.message_,(internal *)local_cc8,
               (AssertionResult *)"base_satoshi_val >= base_amt","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ce0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ce0,&local_cd8);
    testing::internal::AssertHelper::~AssertHelper(&local_ce0);
    std::__cxx11::string::~string((string *)&gtest_ar__38.message_);
    testing::Message::~Message(&local_cd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc8);
  local_d11 = cfd::core::operator>=((Amount *)local_28,0x499602d3);
  local_d11 = !local_d11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d10,&local_d11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d10);
  if (!bVar1) {
    testing::Message::Message(&local_d20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__39.message_,(internal *)local_d10,
               (AssertionResult *)"base_amt >= nq_satoshi_val","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d28,&local_d20);
    testing::internal::AssertHelper::~AssertHelper(&local_d28);
    std::__cxx11::string::~string((string *)&gtest_ar__39.message_);
    testing::Message::~Message(&local_d20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d10);
  local_d59 = cfd::core::operator>=((Amount *)local_28,0x499602d2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d58,&local_d59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d58);
  if (!bVar1) {
    testing::Message::Message(&local_d68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__40.message_,(internal *)local_d58,
               (AssertionResult *)"base_amt >= base_satoshi_val","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d70,&local_d68);
    testing::internal::AssertHelper::~AssertHelper(&local_d70);
    std::__cxx11::string::~string((string *)&gtest_ar__40.message_);
    testing::Message::~Message(&local_d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d58);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_dc8 = AVar3.amount_;
  local_dc0 = AVar3.ignore_check_;
  local_db8.amount_ = local_dc8;
  local_db8.ignore_check_ = (bool)local_dc0;
  local_da1 = cfd::core::operator>=(&local_db8,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_da0,&local_da1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_da0);
  if (!bVar1) {
    testing::Message::Message(&local_dd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__41.message_,(internal *)local_da0,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(nq_satoshi_val) >= base_amt",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_dd8,&local_dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_dd8);
    std::__cxx11::string::~string((string *)&gtest_ar__41.message_);
    testing::Message::~Message(&local_dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_da0);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_e30 = AVar3.amount_;
  local_e28 = AVar3.ignore_check_;
  local_e20.amount_ = local_e30;
  local_e20.ignore_check_ = (bool)local_e28;
  local_e09 = cfd::core::operator>=(&local_e20,(Amount *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e08,&local_e09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
  if (!bVar1) {
    testing::Message::Message(&local_e38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__42.message_,(internal *)local_e08,
               (AssertionResult *)"Amount::CreateBySatoshiAmount(base_satoshi_val) >= base_amt",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e40,&local_e38);
    testing::internal::AssertHelper::~AssertHelper(&local_e40);
    std::__cxx11::string::~string((string *)&gtest_ar__42.message_);
    testing::Message::~Message(&local_e38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d3);
  local_e98 = AVar3.amount_;
  local_e90 = AVar3.ignore_check_;
  local_e88.amount_ = local_e98;
  local_e88.ignore_check_ = (bool)local_e90;
  local_e71 = cfd::core::operator>=((Amount *)local_28,&local_e88);
  local_e71 = !local_e71;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e70,&local_e71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e70);
  if (!bVar1) {
    testing::Message::Message(&local_ea0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__43.message_,(internal *)local_e70,
               (AssertionResult *)"base_amt >= Amount::CreateBySatoshiAmount(nq_satoshi_val)","true"
               ,"false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ea8,&local_ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_ea8);
    std::__cxx11::string::~string((string *)&gtest_ar__43.message_);
    testing::Message::~Message(&local_ea0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e70);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x499602d2);
  local_f00 = AVar3.amount_;
  local_ef8 = AVar3.ignore_check_;
  local_ef0.amount_ = local_f00;
  local_ef0.ignore_check_ = (bool)local_ef8;
  local_ed9 = cfd::core::operator>=((Amount *)local_28,&local_ef0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ed8,&local_ed9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ed8);
  if (!bVar1) {
    testing::Message::Message(&local_f08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f30,(internal *)local_ed8,
               (AssertionResult *)"base_amt >= Amount::CreateBySatoshiAmount(base_satoshi_val)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_amount.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f10,&local_f08);
    testing::internal::AssertHelper::~AssertHelper(&local_f10);
    std::__cxx11::string::~string((string *)&local_f30);
    testing::Message::~Message(&local_f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ed8);
  return;
}

Assistant:

TEST(Amount, ComparisonOperatorsTest) {
  const int64_t base_satoshi_val = 1234567890;
  Amount base_amt = Amount::CreateBySatoshiAmount(base_satoshi_val);
  // compare
  const int64_t nq_satoshi_val = 1234567891;
  // equal
  EXPECT_TRUE(base_satoshi_val == base_amt);
  EXPECT_FALSE(nq_satoshi_val == base_amt);
  EXPECT_TRUE(base_amt == base_satoshi_val);
  EXPECT_FALSE(base_amt == nq_satoshi_val);
  EXPECT_TRUE(base_amt == Amount::CreateBySatoshiAmount(base_satoshi_val));
  EXPECT_FALSE(base_amt == Amount::CreateBySatoshiAmount(nq_satoshi_val));
  // not equal
  EXPECT_TRUE(nq_satoshi_val != base_amt);
  EXPECT_FALSE(base_satoshi_val != base_amt);
  EXPECT_TRUE(base_amt != nq_satoshi_val);
  EXPECT_FALSE(base_amt != base_satoshi_val);
  EXPECT_TRUE(base_amt != Amount::CreateBySatoshiAmount(nq_satoshi_val));
  EXPECT_FALSE(base_amt != Amount::CreateBySatoshiAmount(base_satoshi_val));
  // less
  EXPECT_FALSE(nq_satoshi_val < base_amt);
  EXPECT_FALSE(base_satoshi_val < base_amt);
  EXPECT_TRUE(base_amt < nq_satoshi_val);
  EXPECT_FALSE(base_amt < base_satoshi_val);
  EXPECT_FALSE(Amount::CreateBySatoshiAmount(nq_satoshi_val) < base_amt);
  EXPECT_FALSE(Amount::CreateBySatoshiAmount(base_satoshi_val) < base_amt);
  EXPECT_TRUE(base_amt < Amount::CreateBySatoshiAmount(nq_satoshi_val));
  EXPECT_FALSE(base_amt < Amount::CreateBySatoshiAmount(base_satoshi_val));
  // greater
  EXPECT_TRUE(nq_satoshi_val > base_amt);
  EXPECT_FALSE(base_satoshi_val > base_amt);
  EXPECT_FALSE(base_amt > nq_satoshi_val);
  EXPECT_FALSE(base_amt > base_satoshi_val);
  EXPECT_TRUE(Amount::CreateBySatoshiAmount(nq_satoshi_val) > base_amt);
  EXPECT_FALSE(Amount::CreateBySatoshiAmount(base_satoshi_val) > base_amt);
  EXPECT_FALSE(base_amt > Amount::CreateBySatoshiAmount(nq_satoshi_val));
  EXPECT_FALSE(base_amt > Amount::CreateBySatoshiAmount(base_satoshi_val));
  // less or equal
  EXPECT_FALSE(nq_satoshi_val <= base_amt);
  EXPECT_TRUE(base_satoshi_val <= base_amt);
  EXPECT_TRUE(base_amt <= nq_satoshi_val);
  EXPECT_TRUE(base_amt <= base_satoshi_val);
  EXPECT_FALSE(Amount::CreateBySatoshiAmount(nq_satoshi_val) <= base_amt);
  EXPECT_TRUE(Amount::CreateBySatoshiAmount(base_satoshi_val) <= base_amt);
  EXPECT_TRUE(base_amt <= Amount::CreateBySatoshiAmount(nq_satoshi_val));
  EXPECT_TRUE(base_amt <= Amount::CreateBySatoshiAmount(base_satoshi_val));
  // greater or equal
  EXPECT_TRUE(nq_satoshi_val >= base_amt);
  EXPECT_TRUE(base_satoshi_val >= base_amt);
  EXPECT_FALSE(base_amt >= nq_satoshi_val);
  EXPECT_TRUE(base_amt >= base_satoshi_val);
  EXPECT_TRUE(Amount::CreateBySatoshiAmount(nq_satoshi_val) >= base_amt);
  EXPECT_TRUE(Amount::CreateBySatoshiAmount(base_satoshi_val) >= base_amt);
  EXPECT_FALSE(base_amt >= Amount::CreateBySatoshiAmount(nq_satoshi_val));
  EXPECT_TRUE(base_amt >= Amount::CreateBySatoshiAmount(base_satoshi_val));
}